

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

void __thiscall PrintVisitor::visit(PrintVisitor *this,BinaryOpNode *node)

{
  ExpressionNode *pEVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  PrintVisitor visitor;
  string sStack_58;
  undefined **local_38;
  ostream *local_30;
  int local_28;
  
  poVar2 = this->stream_;
  indent_abi_cxx11_(&sStack_58,this);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_58);
  std::operator<<(poVar2,"BinaryOpNode:\n");
  std::__cxx11::string::~string((string *)&sStack_58);
  local_30 = this->stream_;
  local_28 = this->indentation_ + 1;
  local_38 = &PTR__Visitor_00148d30;
  (**(code **)((long)(((node->leftOperand_)._M_t.
                       super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>
                       .super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl)->super_Node).
                     _vptr_Node + 0x10))();
  poVar2 = this->stream_;
  indent_abi_cxx11_(&sStack_58,this);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_58);
  pmVar3 = std::__detail::
           _Map_base<BinaryOperator,_std::pair<const_BinaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_BinaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<BinaryOperator>,_std::hash<BinaryOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<BinaryOperator,_std::pair<const_BinaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_BinaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<BinaryOperator>,_std::hash<BinaryOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&BinaryOperationNames_abi_cxx11_,&node->operator_);
  poVar2 = std::operator<<(poVar2,(string *)pmVar3);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&sStack_58);
  pEVar1 = (node->rightOperand_)._M_t.
           super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
           super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  (**(code **)((long)(pEVar1->super_Node)._vptr_Node + 0x10))(pEVar1,&local_38);
  return;
}

Assistant:

void PrintVisitor::visit(const BinaryOpNode& node)
{
  stream_ << indent() << "BinaryOpNode:\n";
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  node.getLeftOperand().accept(visitor);
  stream_ << indent() << BinaryOperationNames.at(node.getOperation()) << "\n";
  node.getRightOperand().accept(visitor);
}